

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O2

uint16_t * __thiscall
Apple::IIgs::Video::Video::output_double_high_resolution
          (Video *this,uint16_t *target,int start,int end,int row)

{
  uint16_t uVar1;
  int column;
  long lVar2;
  
  uVar1 = II::VideoSwitches<Cycles>::get_row_address(&this->super_VideoSwitches<Cycles>,row);
  column = start * 2;
  for (lVar2 = (long)start; lVar2 < end; lVar2 = lVar2 + 1) {
    this->ntsc_shift_ =
         this->ntsc_shift_ >> 0xe |
         (uint)this->ram_[lVar2 + ((ulong)uVar1 | 0x10000)] << 0x12 |
         (uint)this->ram_[lVar2 + -0x10000 + ((ulong)uVar1 | 0x10000)] << 0x19;
    target = output_shift(this,target,column);
    column = column + 2;
  }
  return target;
}

Assistant:

uint16_t *Video::output_double_high_resolution(uint16_t *target, int start, int end, int row) {
	const uint16_t row_address = get_row_address(row);
	for(int c = start; c < end; c++) {
		const uint8_t source[2] = {
			ram_[0x10000 + row_address + c],
			ram_[row_address + c],
		};

		ntsc_shift_ = unsigned(source[1] << 25) | unsigned(source[0] << 18) | (ntsc_shift_ >> 14);
		target = output_shift(target, c*2);
	}

	return target;
}